

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O1

int dwarf_siblingof_c(Dwarf_Die die,Dwarf_Die *caller_ret_die,Dwarf_Error *error)

{
  Dwarf_CU_Context_conflict context;
  Dwarf_Debug dbg;
  int iVar1;
  Dwarf_Signed errval;
  
  if (die == (Dwarf_Die)0x0) {
    errval = 0x34;
  }
  else {
    context = die->di_cu_context;
    if (context != (Dwarf_CU_Context_conflict)0x0) {
      dbg = context->cc_dbg;
      if ((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) {
        iVar1 = _dwarf_siblingof_internal(dbg,die,context,context->cc_is_info,caller_ret_die,error);
        return iVar1;
      }
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      return 1;
    }
    errval = 0x68;
  }
  _dwarf_error((Dwarf_Debug)0x0,error,errval);
  return 1;
}

Assistant:

int
dwarf_siblingof_c(Dwarf_Die die,
    Dwarf_Die * caller_ret_die, Dwarf_Error * error)
{
    int res = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Bool is_info = FALSE;

    CHECK_DIE(die,DW_DLV_ERROR);
    dbg =  die->di_cu_context->cc_dbg;
    is_info =  die->di_cu_context->cc_is_info;
    res = _dwarf_siblingof_internal(dbg,die,
        die->di_cu_context, is_info,
        caller_ret_die,error);
    return res;
}